

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O0

void opj_dwt_calc_explicit_stepsizes(opj_tccp_t *tccp,OPJ_UINT32 prec)

{
  OPJ_UINT32 OVar1;
  double dVar2;
  int local_50;
  int local_4c;
  uint local_48;
  int local_44;
  OPJ_FLOAT64 norm;
  OPJ_UINT32 gain;
  OPJ_UINT32 orient;
  OPJ_UINT32 level;
  OPJ_UINT32 resno;
  OPJ_FLOAT64 stepsize;
  OPJ_UINT32 bandno;
  OPJ_UINT32 numbands;
  OPJ_UINT32 prec_local;
  opj_tccp_t *tccp_local;
  
  OVar1 = tccp->numresolutions;
  for (stepsize._4_4_ = 0; stepsize._4_4_ < OVar1 * 3 - 2; stepsize._4_4_ = stepsize._4_4_ + 1) {
    if (stepsize._4_4_ == 0) {
      local_44 = 0;
      local_48 = 0;
    }
    else {
      local_44 = (stepsize._4_4_ - 1) / 3 + 1;
      local_48 = (stepsize._4_4_ - 1) % 3 + 1;
    }
    if (tccp->qmfbid == 0) {
      local_4c = 0;
    }
    else {
      if (local_48 == 0) {
        local_50 = 0;
      }
      else {
        local_50 = 2;
        if (local_48 == 1 || local_48 == 2) {
          local_50 = 1;
        }
      }
      local_4c = local_50;
    }
    if (tccp->qntsty == 0) {
      _level = 1.0;
    }
    else {
      _level = (double)(1 << (sbyte)local_4c) /
               (double)opj_dwt_norms_real[local_48][(tccp->numresolutions - 1) - local_44];
    }
    dVar2 = floor(_level * 8192.0);
    opj_dwt_encode_stepsize((int)dVar2,prec + local_4c,tccp->stepsizes + stepsize._4_4_);
  }
  return;
}

Assistant:

void opj_dwt_calc_explicit_stepsizes(opj_tccp_t * tccp, OPJ_UINT32 prec) {
	OPJ_UINT32 numbands, bandno;
	numbands = 3 * tccp->numresolutions - 2;
	for (bandno = 0; bandno < numbands; bandno++) {
		OPJ_FLOAT64 stepsize;
		OPJ_UINT32 resno, level, orient, gain;

		resno = (bandno == 0) ? 0 : ((bandno - 1) / 3 + 1);
		orient = (bandno == 0) ? 0 : ((bandno - 1) % 3 + 1);
		level = tccp->numresolutions - 1 - resno;
		gain = (tccp->qmfbid == 0) ? 0 : ((orient == 0) ? 0 : (((orient == 1) || (orient == 2)) ? 1 : 2));
		if (tccp->qntsty == J2K_CCP_QNTSTY_NOQNT) {
			stepsize = 1.0;
		} else {
			OPJ_FLOAT64 norm = opj_dwt_norms_real[orient][level];
			stepsize = (1 << (gain)) / norm;
		}
		opj_dwt_encode_stepsize((OPJ_INT32) floor(stepsize * 8192.0), (OPJ_INT32)(prec + gain), &tccp->stepsizes[bandno]);
	}
}